

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall
caffe::WindowDataParameter::SerializeWithCachedSizes
          (WindowDataParameter *this,CodedOutputStream *output)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint32 uVar4;
  char *pcVar5;
  string *psVar6;
  UnknownFieldSet *unknown_fields;
  float fVar7;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  WindowDataParameter *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    source_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    source_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar3,SERIALIZE,"caffe.WindowDataParameter.source");
    psVar6 = source_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(1,psVar6,output);
  }
  if ((uVar1 & 0x200) != 0) {
    fVar7 = scale(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(2,fVar7,output);
  }
  if ((uVar1 & 2) != 0) {
    mean_file_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    mean_file_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar3,SERIALIZE,"caffe.WindowDataParameter.mean_file");
    psVar6 = mean_file_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(3,psVar6,output);
  }
  if ((uVar1 & 0x10) != 0) {
    uVar4 = batch_size(this);
    google::protobuf::internal::WireFormatLite::WriteUInt32(4,uVar4,output);
  }
  if ((uVar1 & 0x20) != 0) {
    uVar4 = crop_size(this);
    google::protobuf::internal::WireFormatLite::WriteUInt32(5,uVar4,output);
  }
  if ((uVar1 & 0x40) != 0) {
    bVar2 = mirror(this);
    google::protobuf::internal::WireFormatLite::WriteBool(6,bVar2,output);
  }
  if ((uVar1 & 0x400) != 0) {
    fVar7 = fg_threshold(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(7,fVar7,output);
  }
  if ((uVar1 & 0x800) != 0) {
    fVar7 = bg_threshold(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(8,fVar7,output);
  }
  if ((uVar1 & 0x1000) != 0) {
    fVar7 = fg_fraction(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(9,fVar7,output);
  }
  if ((uVar1 & 0x100) != 0) {
    uVar4 = context_pad(this);
    google::protobuf::internal::WireFormatLite::WriteUInt32(10,uVar4,output);
  }
  if ((uVar1 & 4) != 0) {
    crop_mode_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    crop_mode_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar3,SERIALIZE,"caffe.WindowDataParameter.crop_mode");
    psVar6 = crop_mode_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0xb,psVar6,output);
  }
  if ((uVar1 & 0x80) != 0) {
    bVar2 = cache_images(this);
    google::protobuf::internal::WireFormatLite::WriteBool(0xc,bVar2,output);
  }
  if ((uVar1 & 8) != 0) {
    root_folder_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    root_folder_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar3,SERIALIZE,"caffe.WindowDataParameter.root_folder");
    psVar6 = root_folder_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0xd,psVar6,output);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = WindowDataParameter::unknown_fields(this);
    google::protobuf::internal::WireFormat::SerializeUnknownFields(unknown_fields,output);
  }
  return;
}

Assistant:

void WindowDataParameter::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:caffe.WindowDataParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string source = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->source().data(), this->source().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.WindowDataParameter.source");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->source(), output);
  }

  // optional float scale = 2 [default = 1];
  if (cached_has_bits & 0x00000200u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(2, this->scale(), output);
  }

  // optional string mean_file = 3;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->mean_file().data(), this->mean_file().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.WindowDataParameter.mean_file");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      3, this->mean_file(), output);
  }

  // optional uint32 batch_size = 4;
  if (cached_has_bits & 0x00000010u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(4, this->batch_size(), output);
  }

  // optional uint32 crop_size = 5 [default = 0];
  if (cached_has_bits & 0x00000020u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(5, this->crop_size(), output);
  }

  // optional bool mirror = 6 [default = false];
  if (cached_has_bits & 0x00000040u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(6, this->mirror(), output);
  }

  // optional float fg_threshold = 7 [default = 0.5];
  if (cached_has_bits & 0x00000400u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(7, this->fg_threshold(), output);
  }

  // optional float bg_threshold = 8 [default = 0.5];
  if (cached_has_bits & 0x00000800u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(8, this->bg_threshold(), output);
  }

  // optional float fg_fraction = 9 [default = 0.25];
  if (cached_has_bits & 0x00001000u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(9, this->fg_fraction(), output);
  }

  // optional uint32 context_pad = 10 [default = 0];
  if (cached_has_bits & 0x00000100u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(10, this->context_pad(), output);
  }

  // optional string crop_mode = 11 [default = "warp"];
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->crop_mode().data(), this->crop_mode().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.WindowDataParameter.crop_mode");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      11, this->crop_mode(), output);
  }

  // optional bool cache_images = 12 [default = false];
  if (cached_has_bits & 0x00000080u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(12, this->cache_images(), output);
  }

  // optional string root_folder = 13 [default = ""];
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->root_folder().data(), this->root_folder().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.WindowDataParameter.root_folder");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      13, this->root_folder(), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:caffe.WindowDataParameter)
}